

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

MacroFormalArgumentListSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::MacroFormalArgumentListSyntax,slang::syntax::MacroFormalArgumentListSyntax_const&>
          (BumpAllocator *this,MacroFormalArgumentListSyntax *args)

{
  MacroFormalArgumentListSyntax *pMVar1;
  MacroFormalArgumentListSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pMVar1 = (MacroFormalArgumentListSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::MacroFormalArgumentListSyntax::MacroFormalArgumentListSyntax(in_RSI,pMVar1);
  return pMVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }